

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

double get_min_cr(AV1LevelSpec *level_spec,int tier,int is_still_picture,int64_t decoded_sample_rate
                 )

{
  double local_40;
  double local_38;
  double speed_adj;
  double min_cr_basis;
  int64_t decoded_sample_rate_local;
  int is_still_picture_local;
  int tier_local;
  AV1LevelSpec *level_spec_local;
  double local_8;
  
  if (is_still_picture == 0) {
    tier_local = tier;
    if (level_spec->level < 8) {
      tier_local = 0;
    }
    if (tier_local == 0) {
      local_38 = level_spec->main_cr;
    }
    else {
      local_38 = level_spec->high_cr;
    }
    local_40 = (double)decoded_sample_rate / (double)level_spec->max_display_rate;
    if (local_38 * local_40 <= 0.8) {
      local_40 = 0.8;
    }
    else {
      local_40 = local_38 * local_40;
    }
    local_8 = local_40;
  }
  else {
    local_8 = 0.8;
  }
  return local_8;
}

Assistant:

static double get_min_cr(const AV1LevelSpec *const level_spec, int tier,
                         int is_still_picture, int64_t decoded_sample_rate) {
  if (is_still_picture) return 0.8;
  if (level_spec->level < SEQ_LEVEL_4_0) tier = 0;
  const double min_cr_basis = tier ? level_spec->high_cr : level_spec->main_cr;
  const double speed_adj =
      (double)decoded_sample_rate / level_spec->max_display_rate;
  return AOMMAX(min_cr_basis * speed_adj, 0.8);
}